

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

int __thiscall
TPZSkylMatrix<std::complex<long_double>_>::Zero(TPZSkylMatrix<std::complex<long_double>_> *this)

{
  complex<long_double> *pcVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (this->fStorage).fNElements;
  if (0 < lVar2) {
    lVar3 = 0x10;
    do {
      pcVar1 = (this->fStorage).fStore;
      *(longdouble *)(pcVar1->_M_value + lVar3 + -0x10) = (longdouble)0;
      *(longdouble *)(pcVar1->_M_value + lVar3) = (longdouble)0;
      lVar3 = lVar3 + 0x20;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  return 1;
}

Assistant:

void TPZVec<T>::Fill(const T& copy, const int64_t from, const int64_t numelem){
#ifndef PZNODEBUG
	if(numelem<0 && numelem != -1) {
		PZError << "TPZVec::Fill" << std::endl
		<< "It's negative parameter numelem, then numelem = "
		<< fNElements << std::endl;
		
		PZError.flush();
	}
#endif
	
	int64_t first = (from < 0) ? 0 : from;
	int64_t nel = numelem;
	first = (first > fNElements) ? fNElements : first;
	if (nel < 0) nel = fNElements;
	int64_t last = (from+nel > fNElements) ? fNElements : from+nel;
	
	for(int64_t i=first; i<last; i++)
		fStore[i] = copy;
}